

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  pointer pfVar1;
  int iVar2;
  pthread_t pVar3;
  ostream *poVar4;
  future<void> *iter;
  pointer this;
  string inputFile;
  vector<std::future<void>,_std::allocator<std::future<void>_>_> results;
  string symbolName;
  string streamType;
  type func;
  StockMatcher matcher;
  string local_608;
  vector<std::future<void>,_std::allocator<std::future<void>_>_> local_5e8;
  undefined1 local_5d0 [16];
  string local_5c0;
  _Any_data *local_5a0 [2];
  _Any_data local_590;
  code *local_580;
  _Elt_pointer local_578;
  StockMatcher *local_570;
  undefined1 local_568 [40];
  undefined1 local_540 [784];
  undefined1 local_230 [520];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_28;
  
  if (argc == 4) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_608,argv[1],(allocator<char> *)local_568);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(local_5d0 + 0x10),argv[2],(allocator<char> *)local_568);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_5a0,argv[3],(allocator<char> *)local_568);
    iVar2 = std::__cxx11::string::compare((char *)local_5a0);
    StockMatcher::StockMatcher
              ((StockMatcher *)local_568,(string *)(local_5d0 + 0x10),&local_608,(uint)(iVar2 != 0))
    ;
    local_580 = StockMatcher::executeMatching;
    local_578 = (_Elt_pointer)0x0;
    local_5e8.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_5e8.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>._M_impl.
    super__Vector_impl_data._M_start = (future<void> *)0x0;
    local_5e8.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (future<void> *)0x0;
    local_570 = (StockMatcher *)local_568;
    ThreadPool::enqueue<std::_Bind<void(StockMatcher::*(StockMatcher*))()>&>
              ((ThreadPool *)local_5d0,(_Bind<void_(StockMatcher::*(StockMatcher_*))()> *)&pool);
    std::vector<std::future<void>,std::allocator<std::future<void>>>::
    emplace_back<std::future<void>>
              ((vector<std::future<void>,std::allocator<std::future<void>>> *)&local_5e8,
               (future<void> *)local_5d0);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5d0._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5d0._8_8_);
    }
    poVar4 = (ostream *)&std::cout;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Main Thread id = ",0x11);
    pVar3 = pthread_self();
    if (pVar3 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"thread::id of a non-executing thread",0x24);
    }
    else {
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    pfVar1 = local_5e8.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (this = local_5e8.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>
                ._M_impl.super__Vector_impl_data._M_start; this != pfVar1; this = this + 1) {
      std::future<void>::get(this);
    }
    std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::~vector(&local_5e8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_28);
    std::ifstream::~ifstream(local_230);
    MatchingEngine::~MatchingEngine((MatchingEngine *)local_540);
    if ((undefined1 *)local_568._0_8_ != local_568 + 0x10) {
      operator_delete((void *)local_568._0_8_,local_568._16_8_ + 1);
    }
    if (local_5a0[0] != &local_590) {
      operator_delete(local_5a0[0],local_590._M_unused._M_member_pointer + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5c0._M_dataplus._M_p != &local_5c0.field_2) {
      operator_delete(local_5c0._M_dataplus._M_p,local_5c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_608._M_dataplus._M_p == &local_608.field_2) {
      return 0;
    }
  }
  else {
    if (argc != 2) {
      poVar4 = std::operator<<((ostream *)&std::cout,
                               "Invalid Usage : Proper usage is OrderMatchingEngine [inputfile] [symbol] [F/C]"
                              );
      std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::operator<<((ostream *)&std::cout,
                               "Invalid Usage : Proper usage is OrderMatchingEngine [feedConfigFile]"
                              );
      std::endl<char,std::char_traits<char>>(poVar4);
      exit(1);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_608,argv[1],(allocator<char> *)(local_5d0 + 0x10));
    FeedFileHandler::FeedFileHandler((FeedFileHandler *)local_568,&local_608,&pool);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_608._M_dataplus._M_p != &local_608.field_2) {
      operator_delete(local_608._M_dataplus._M_p,local_608.field_2._M_allocated_capacity + 1);
    }
    FeedFileHandler::process((FeedFileHandler *)local_568);
    std::
    vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>_>_>
    ::~vector((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>_>_>
               *)(local_540 + 0x208));
    std::ifstream::~ifstream(local_540);
    local_608.field_2._M_allocated_capacity = local_568._16_8_;
    local_608._M_dataplus._M_p = (pointer)local_568._0_8_;
    if ((undefined1 *)local_568._0_8_ == local_568 + 0x10) {
      return 0;
    }
  }
  operator_delete(local_608._M_dataplus._M_p,local_608.field_2._M_allocated_capacity + 1);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
	if(argc == 2)
	{
		FeedFileHandler handler(argv[1],pool);
		handler.process();
		return(0);
	}

	if(argc != 4 && argc != 2)
	{
		std::cout << "Invalid Usage : Proper usage is OrderMatchingEngine [inputfile] [symbol] [F/C]" << std::endl;
		std::cout << "Invalid Usage : Proper usage is OrderMatchingEngine [feedConfigFile]" << std::endl;
		exit(1);
	}

	std::string inputFile = argv[1];
	std::string symbolName = argv[2];
	std::string streamType = argv[3];
	outputStreamType stream;

	if(streamType == "F")
		stream = outputStreamType::fileStream;
	else
		stream = outputStreamType::consoleStream;

	StockMatcher matcher(symbolName , inputFile, stream);
	auto func = std::bind(&StockMatcher::executeMatching, &matcher);
	std::vector<std::future<void>> results;
	results.emplace_back(pool.enqueue(func));
	std::cout << "Main Thread id = " << std::this_thread::get_id() << std::endl;
	for(auto&& iter : results)
		iter.get();
	return(0);
}